

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdGetPsbtBip32Data(void *handle,void *psbt_handle,int kind,uint32_t index,char *pubkey,
                       char **fingerprint,char **bip32_path)

{
  pointer pKVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  CfdException *pCVar6;
  pointer this;
  int kind_local;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  char *work_fingerprint;
  ExtPubkey local_3f8;
  Pubkey target_pubkey;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_370;
  ExtPubkey local_358;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2e8;
  KeyData key;
  KeyData pk_obj;
  
  kind_local = kind;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&pk_obj,"PsbtHandle",(allocator *)&key);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&pk_obj);
  std::__cxx11::string::~string((string *)&pk_obj);
  if (pubkey == (char *)0x0) {
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x684;
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtBip32Data";
    cfd::core::logger::warn<>((CfdSourceLocation *)&pk_obj,"pubkey is null.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&pk_obj,"Failed to parameter. pubkey is null.",(allocator *)&key);
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&pk_obj);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) == 0) {
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x68a;
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtBip32Data";
    cfd::core::logger::warn<>((CfdSourceLocation *)&pk_obj,"psbt is null.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&pk_obj,"Failed to handle statement. psbt is null.",(allocator *)&key);
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)&pk_obj);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::capi::ParsePubkey(&pk_obj,kind,pubkey,*(NetType *)((long)psbt_handle + 0x10));
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (kind == 4) {
    cfd::core::Psbt::GetGlobalXpubkeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&key,
               *(Psbt **)((long)psbt_handle + 0x18));
  }
  else if (kind == 3) {
    cfd::core::Psbt::GetTxOutKeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&key,
               *(Psbt **)((long)psbt_handle + 0x18),index);
  }
  else {
    if (kind != 2) {
      key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
      key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x699;
      key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtBip32Data";
      cfd::core::logger::warn<int&>((CfdSourceLocation *)&key,"kind is invalid: {}",&kind_local);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&key,"Failed to parameter. kind is invalid.",(allocator *)&local_3f8);
      cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&key);
      __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::Psbt::GetTxInKeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&key,
               *(Psbt **)((long)psbt_handle + 0x18),index);
  }
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::_M_move_assign
            (&key_list,&key);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&key);
  cfd::core::KeyData::KeyData(&key);
  bVar2 = cfd::core::KeyData::HasExtPubkey(&pk_obj);
  cfd::core::KeyData::GetPubkey(&target_pubkey,&pk_obj);
  pKVar1 = key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this = key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
         _M_impl.super__Vector_impl_data._M_start;
  do {
    if (this == pKVar1) {
LAB_0038a6d0:
      bVar2 = cfd::core::KeyData::IsValid(&key);
      if (bVar2) {
        if (fingerprint == (char **)0x0) {
          pcVar4 = (char *)0x0;
        }
        else {
          cfd::core::KeyData::GetFingerprint(&local_358.serialize_data_,&key);
          cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_3f8,&local_358.serialize_data_);
          pcVar4 = cfd::capi::CreateString((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_358);
        }
        if (bip32_path == (char **)0x0) {
          pcVar5 = (char *)0x0;
        }
        else {
          cfd::core::KeyData::GetBip32Path_abi_cxx11_((string *)&local_3f8,&key,kApostrophe,false);
          pcVar5 = cfd::capi::CreateString((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_3f8);
        }
        if (fingerprint != (char **)0x0) {
          *fingerprint = pcVar4;
        }
        if (bip32_path != (char **)0x0) {
          *bip32_path = pcVar5;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&target_pubkey);
        cfd::core::KeyData::~KeyData(&key);
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&key_list);
        cfd::core::KeyData::~KeyData(&pk_obj);
        return 0;
      }
      local_358.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
      local_358.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x6b1;
      local_358.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtBip32Data";
      cfd::core::KeyData::ToString_abi_cxx11_((string *)&local_3f8,&pk_obj,true,kApostrophe,false);
      cfd::core::logger::warn<std::__cxx11::string>
                ((CfdSourceLocation *)&local_358,"pubkey not found: {}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_3f8);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_3f8,"Failed to parameter. pubkey not found",
                 (allocator *)&local_358);
      cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_3f8);
      __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::KeyData::GetPubkey((Pubkey *)&local_3f8,this);
    bVar3 = cfd::core::Pubkey::Equals((Pubkey *)&local_3f8,&target_pubkey);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3f8);
    if (bVar3) {
      if (bVar2) {
        cfd::core::KeyData::GetExtPubkey(&local_3f8,this);
        cfd::core::ExtPubkey::GetData((ByteData *)&local_370,&local_3f8);
        cfd::core::KeyData::GetExtPubkey(&local_358,&pk_obj);
        cfd::core::ExtPubkey::GetData((ByteData *)&local_2e8,&local_358);
        bVar3 = cfd::core::ByteData::Equals((ByteData *)&local_370,(ByteData *)&local_2e8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2e8);
        cfd::core::ExtPubkey::~ExtPubkey(&local_358);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_370);
        cfd::core::ExtPubkey::~ExtPubkey(&local_3f8);
        if (!bVar3) goto LAB_0038a6b4;
      }
      cfd::core::KeyData::operator=(&key,this);
      goto LAB_0038a6d0;
    }
LAB_0038a6b4:
    this = this + 1;
  } while( true );
}

Assistant:

int CfdGetPsbtBip32Data(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    const char* pubkey, char** fingerprint, char** bip32_path) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_fingerprint = nullptr;
  char* work_path = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    KeyData pk_obj = ParsePubkey(kind, pubkey, psbt_obj->net_type);

    std::vector<KeyData> key_list;
    if (kind == kCfdPsbtRecordInputBip32) {
      key_list = psbt_obj->psbt->GetTxInKeyDataList(index);
    } else if (kind == kCfdPsbtRecordOutputBip32) {
      key_list = psbt_obj->psbt->GetTxOutKeyDataList(index);
    } else if (kind == kCfdPsbtRecordGloalXpub) {
      key_list = psbt_obj->psbt->GetGlobalXpubkeyDataList();
    } else {
      warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. kind is invalid.");
    }

    KeyData key;
    bool has_extpubkey = pk_obj.HasExtPubkey();
    Pubkey target_pubkey = pk_obj.GetPubkey();
    for (const auto& temp_key : key_list) {
      if (temp_key.GetPubkey().Equals(target_pubkey)) {
        if (has_extpubkey) {
          if (temp_key.GetExtPubkey().GetData().Equals(
                  pk_obj.GetExtPubkey().GetData())) {
            key = temp_key;
            break;
          }
        } else {
          key = temp_key;
          break;
        }
      }
    }
    if (!key.IsValid()) {
      warn(CFD_LOG_SOURCE, "pubkey not found: {}", pk_obj.ToString());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey not found");
    }

    if (fingerprint != nullptr) {
      work_fingerprint = CreateString(key.GetFingerprint().GetHex());
    }
    if (bip32_path != nullptr) work_path = CreateString(key.GetBip32Path());

    if (fingerprint != nullptr) *fingerprint = work_fingerprint;
    if (bip32_path != nullptr) *bip32_path = work_path;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_fingerprint, &work_path);
  return result;
}